

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::startElement
          (AbstractDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  DOMAttrMapImpl *this_00;
  DOMDocumentImpl *pDVar1;
  XMLBufferMgr *pXVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  AttTypes AVar9;
  DefAttTypes DVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLAttr *this_01;
  XMLCh *pXVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNodeIDMap *this_02;
  long *plVar14;
  ulong uVar15;
  XMLAttDef *this_03;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMParentNode *pDVar16;
  DOMNode *local_240;
  DOMDocument *local_1b0;
  DOMNode *remAttr_1;
  DOMAttr *remAttr;
  XMLCh *namespaceURI_1;
  uint uriId;
  int colonPos;
  XMLBuffer *prefixBuf;
  XMLBufBid bbPrefixQName;
  XMLCh *qualifiedName;
  ulong uStack_e8;
  DefAttTypes defType;
  XMLSize_t i;
  DOMAttrImpl *insertAttr;
  XMLAttDef *attr_1;
  XMLAttDefList *defAttrs;
  XMLCh *prefix;
  XMLCh *localName_1;
  DOMNode *pDStack_b0;
  uint attrURIId;
  DOMAttrImpl *attr;
  XMLAttr *oneAttrib;
  XMLSize_t index;
  DOMAttrMapImpl *map;
  uint emptyNSId;
  uint xmlnsNSId;
  undefined1 local_78 [8];
  XMLBufBid elemQName;
  XMLCh *localName;
  XMLCh *pXStack_58;
  bool doNamespaces;
  XMLCh *namespaceURI;
  DOMElementImpl *elemImpl;
  DOMElement *elem;
  bool isRoot_local;
  bool isEmpty_local;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLCh *elemPrefix_local;
  uint urlId_local;
  XMLElementDecl *elemDecl_local;
  AbstractDOMParser *this_local;
  undefined4 extraout_var_05;
  
  bVar3 = XMLScanner::getDoNamespaces(this->fScanner);
  if (bVar3) {
    elemQName.fMgr = (XMLBufferMgr *)XMLElementDecl::getBaseName(elemDecl);
    uVar5 = XMLScanner::getEmptyNamespaceId(this->fScanner);
    if (urlId == uVar5) {
      iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                        (this,0,0,elemQName.fMgr,elemQName.fMgr);
      elemImpl = (DOMElementImpl *)CONCAT44(extraout_var_01,iVar6);
    }
    else {
      pXVar11 = XMLScanner::getURIText(this->fScanner,urlId);
      if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
        iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                          (this,pXVar11,0,elemQName.fMgr,elemQName.fMgr);
        elemImpl = (DOMElementImpl *)CONCAT44(extraout_var_00,iVar6);
      }
      else {
        XMLBufBid::XMLBufBid((XMLBufBid *)local_78,&this->fBufMgr);
        XMLBufBid::set((XMLBufBid *)local_78,elemPrefix,0);
        XMLBufBid::append((XMLBufBid *)local_78,L':');
        XMLBufBid::append((XMLBufBid *)local_78,(XMLCh *)elemQName.fMgr,0);
        pXVar2 = elemQName.fMgr;
        pXVar12 = XMLBufBid::getRawBuffer((XMLBufBid *)local_78);
        iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                          (this,pXVar11,elemPrefix,pXVar2,pXVar12);
        elemImpl = (DOMElementImpl *)CONCAT44(extraout_var,iVar6);
        XMLBufBid::~XMLBufBid((XMLBufBid *)local_78);
      }
    }
  }
  else {
    pXVar11 = XMLElementDecl::getFullName(elemDecl);
    iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x24])(this,pXVar11);
    elemImpl = (DOMElementImpl *)CONCAT44(extraout_var_02,iVar6);
  }
  if (attrCount != 0) {
    uVar5 = XMLScanner::getXMLNSNamespaceId(this->fScanner);
    uVar7 = XMLScanner::getEmptyNamespaceId(this->fScanner);
    this_00 = elemImpl->fAttributes;
    DOMAttrMapImpl::reserve(this_00,attrCount);
    for (oneAttrib = (XMLAttr *)0x0; oneAttrib < attrCount;
        oneAttrib = (XMLAttr *)&oneAttrib->field_0x1) {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                           (XMLSize_t)oneAttrib);
      if (bVar3) {
        uVar8 = XMLAttr::getURIId(this_01);
        pXVar11 = XMLAttr::getName(this_01);
        pXVar12 = XMLAttr::getPrefix(this_01);
        pXStack_58 = (XMLCh *)0x0;
        if (((pXVar12 == (XMLCh *)0x0) || (localName_1._4_4_ = uVar8, *pXVar12 == L'\0')) &&
           (bVar4 = XMLString::equals(pXVar11,(XMLCh *)XMLUni::fgXMLNSString),
           localName_1._4_4_ = uVar5, !bVar4)) {
          localName_1._4_4_ = uVar8;
        }
        if (localName_1._4_4_ != uVar7) {
          pXStack_58 = XMLScanner::getURIText(this->fScanner,localName_1._4_4_);
        }
        pXVar13 = XMLAttr::getQName(this_01);
        iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x27])
                          (this,pXStack_58,pXVar12,pXVar11,pXVar13);
        pDStack_b0 = (DOMNode *)CONCAT44(extraout_var_03,iVar6);
        DOMAttrMapImpl::setNamedItemNSFast(this_00,pDStack_b0);
      }
      else {
        pXVar11 = XMLAttr::getName(this_01);
        iVar6 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x26])(this,pXVar11);
        pDStack_b0 = (DOMNode *)CONCAT44(extraout_var_04,iVar6);
        DOMAttrMapImpl::setNamedItemFast(this_00,pDStack_b0);
      }
      pXVar11 = XMLAttr::getValue(this_01);
      (*pDStack_b0->_vptr_DOMNode[0x38])(pDStack_b0,pXVar11);
      AVar9 = XMLAttr::getType(this_01);
      if (AVar9 == ID) {
        if (this->fDocument->fNodeIDMap == (DOMNodeIDMap *)0x0) {
          this_02 = (DOMNodeIDMap *)operator_new(0x30,this->fDocument);
          local_1b0 = (DOMDocument *)0x0;
          if (this->fDocument != (DOMDocumentImpl *)0x0) {
            local_1b0 = &this->fDocument->super_DOMDocument;
          }
          DOMNodeIDMap::DOMNodeIDMap(this_02,500,local_1b0);
          this->fDocument->fNodeIDMap = this_02;
        }
        DOMNodeIDMap::add(this->fDocument->fNodeIDMap,(DOMAttr *)pDStack_b0);
        DOMNodeImpl::isIdAttr((DOMNodeImpl *)(pDStack_b0 + 3),true);
      }
      bVar4 = XMLAttr::getSpecified(this_01);
      (*pDStack_b0->_vptr_DOMNode[0x33])(pDStack_b0,(ulong)bVar4);
      if ((this->fCreateSchemaInfo & 1U) != 0) {
        AVar9 = XMLAttr::getType(this_01);
        switch(AVar9) {
        case AttTypes_Min:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute);
          break;
        case ID:
          (*pDStack_b0->_vptr_DOMNode[0x35])(pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedIDAttribute);
          break;
        case IDRef:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute);
          break;
        case IDRefs:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute);
          break;
        case Entity:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute);
          break;
        case Entities:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute);
          break;
        case NmToken:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute);
          break;
        case NmTokens:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute);
          break;
        case Notation:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute);
          break;
        case Enumeration:
          (*pDStack_b0->_vptr_DOMNode[0x35])
                    (pDStack_b0,DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute);
          break;
        default:
          (*pDStack_b0->_vptr_DOMNode[0x35])(pDStack_b0,DOMTypeInfoImpl::g_DtdNotValidatedAttribute)
          ;
        }
      }
    }
  }
  uVar5 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((uVar5 & 1) != 0) {
    iVar6 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar14 = (long *)CONCAT44(extraout_var_05,iVar6);
    for (uStack_e8 = 0; uVar15 = (**(code **)(*plVar14 + 0x50))(), uStack_e8 < uVar15;
        uStack_e8 = uStack_e8 + 1) {
      this_03 = (XMLAttDef *)(**(code **)(*plVar14 + 0x58))(plVar14,uStack_e8);
      DVar10 = XMLAttDef::getDefaultType(this_03);
      if ((DVar10 == DefAttTypes_Min) || (DVar10 == Fixed)) {
        if (bVar3) {
          iVar6 = (*(this_03->super_XSerializable)._vptr_XSerializable[5])();
          bbPrefixQName.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var_06,iVar6);
          XMLBufBid::XMLBufBid((XMLBufBid *)&prefixBuf,&this->fBufMgr);
          _uriId = XMLBufBid::getBuffer((XMLBufBid *)&prefixBuf);
          namespaceURI_1._4_4_ = 0xffffffff;
          namespaceURI_1._0_4_ =
               XMLScanner::resolveQName
                         (this->fScanner,(XMLCh *)bbPrefixQName.fMgr,_uriId,Mode_Attribute,
                          (int *)((long)&namespaceURI_1 + 4));
          remAttr = (DOMAttr *)0x0;
          bVar4 = XMLString::equals((XMLCh *)bbPrefixQName.fMgr,(XMLCh *)XMLUni::fgXMLNSString);
          if (bVar4) {
            namespaceURI_1._0_4_ = XMLScanner::getXMLNSNamespaceId(this->fScanner);
          }
          uVar5 = (uint)namespaceURI_1;
          uVar7 = XMLScanner::getEmptyNamespaceId(this->fScanner);
          if (uVar5 != uVar7) {
            remAttr = (DOMAttr *)XMLScanner::getURIText(this->fScanner,(uint)namespaceURI_1);
          }
          iVar6 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                            (this->fDocument,remAttr,bbPrefixQName.fMgr);
          i = CONCAT44(extraout_var_07,iVar6);
          iVar6 = (*(elemImpl->super_DOMElement).super_DOMNode._vptr_DOMNode[0x49])(elemImpl,i);
          if ((long *)CONCAT44(extraout_var_08,iVar6) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0x138))();
          }
          XMLBufBid::~XMLBufBid((XMLBufBid *)&prefixBuf);
        }
        else {
          pDVar1 = this->fDocument;
          iVar6 = (*(this_03->super_XSerializable)._vptr_XSerializable[5])();
          iVar6 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])
                            (pDVar1,CONCAT44(extraout_var_09,iVar6));
          i = CONCAT44(extraout_var_10,iVar6);
          iVar6 = (*(elemImpl->super_DOMElement).super_DOMNode._vptr_DOMNode[0x48])(elemImpl,i);
          if ((long *)CONCAT44(extraout_var_11,iVar6) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x138))();
          }
        }
        pXVar11 = XMLAttDef::getValue(this_03);
        if (pXVar11 != (XMLCh *)0x0) {
          pXVar11 = XMLAttDef::getValue(this_03);
          (**(code **)(*(long *)i + 0x1c0))(i,pXVar11);
          (**(code **)(*(long *)i + 0x198))(i,0);
        }
        if ((this->fCreateSchemaInfo & 1U) != 0) {
          AVar9 = XMLAttDef::getType(this_03);
          switch(AVar9) {
          case AttTypes_Min:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute);
            break;
          case ID:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedIDAttribute);
            break;
          case IDRef:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute);
            break;
          case IDRefs:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute);
            break;
          case Entity:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute);
            break;
          case Entities:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute);
            break;
          case NmToken:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute);
            break;
          case NmTokens:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute);
            break;
          case Notation:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute);
            break;
          case Enumeration:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute)
            ;
            break;
          default:
            (**(code **)(*(long *)i + 0x1a8))(i,DOMTypeInfoImpl::g_DtdNotValidatedAttribute);
          }
        }
      }
      (*(this_03->super_XSerializable)._vptr_XSerializable[6])();
    }
  }
  local_240 = (DOMNode *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_240 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  }
  if (this->fCurrentParent == local_240) {
    (*this->fCurrentParent->_vptr_DOMNode[0x11])(this->fCurrentParent,elemImpl);
  }
  else {
    pDVar16 = castToParentImpl(this->fCurrentParent);
    (**pDVar16->_vptr_DOMParentNode)(pDVar16,elemImpl);
  }
  this->fCurrentParent = (DOMNode *)elemImpl;
  this->fCurrentNode = (DOMNode *)elemImpl;
  this->fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)urlId,(ulong)isRoot,elemPrefix);
  }
  return;
}

Assistant:

void AbstractDOMParser::startElement(const XMLElementDecl&   elemDecl
                             , const unsigned int            urlId
                             , const XMLCh* const            elemPrefix
                             , const RefVectorOf<XMLAttr>&   attrList
                             , const XMLSize_t               attrCount
                             , const bool                    isEmpty
                             , const bool                    isRoot)
{
    DOMElement     *elem;
    DOMElementImpl *elemImpl;
    const XMLCh* namespaceURI = 0;
    bool doNamespaces = fScanner->getDoNamespaces();

    // Create the element name. Here we are going to bypass the
    // DOMDocument::createElement() interface and instantiate the
    // required types directly in order to avoid name checking
    // overhead.
    //
    if (doNamespaces)
    {
        //DOM Level 2, doNamespaces on
        //
        const XMLCh* localName = elemDecl.getBaseName();

        if (urlId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix

            namespaceURI = fScanner->getURIText(urlId); //get namespaceURI

            if (elemPrefix && *elemPrefix)
            {
                XMLBufBid elemQName(&fBufMgr);

                elemQName.set(elemPrefix);
                elemQName.append(chColon);
                elemQName.append(localName);

                elem = createElementNS (
                  namespaceURI, elemPrefix, localName, elemQName.getRawBuffer());
            }
            else
              elem = createElementNS (namespaceURI, 0, localName, localName);
        }
        else
          elem = createElementNS (namespaceURI, 0, localName, localName);
    }
    else
    {   //DOM Level 1
        elem = createElement (elemDecl.getFullName());
    }

    elemImpl = (DOMElementImpl *) elem;

    if (attrCount)
    {
      unsigned int xmlnsNSId = fScanner->getXMLNSNamespaceId();
      unsigned int emptyNSId = fScanner->getEmptyNamespaceId();

      DOMAttrMapImpl* map = elemImpl->fAttributes;
      map->reserve (attrCount);

      for (XMLSize_t index = 0; index < attrCount; ++index)
      {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        DOMAttrImpl *attr = 0;

        if (doNamespaces)
        {
            //DOM Level 2, doNamespaces on
            //
            unsigned int attrURIId = oneAttrib->getURIId();
            const XMLCh* localName = oneAttrib->getName();
            const XMLCh* prefix = oneAttrib->getPrefix();
            namespaceURI = 0;

            if ((prefix==0 || *prefix==0) && XMLString::equals(localName, XMLUni::fgXMLNSString))
            {
                // xmlns=...
                attrURIId = xmlnsNSId;
            }
            if (attrURIId != emptyNSId)
            {
                //TagName has a prefix
                namespaceURI = fScanner->getURIText(attrURIId);
            }

            attr = (DOMAttrImpl*) createAttrNS (namespaceURI,
                                                prefix,
                                                localName,
                                                oneAttrib->getQName());

            map->setNamedItemNSFast(attr);
        }
        else
        {
            attr = (DOMAttrImpl*) createAttr (oneAttrib->getName());
            map->setNamedItemFast(attr);
        }

        attr->setValueFast(oneAttrib->getValue());

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        //
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());

        // store DTD validation information
        if(fCreateSchemaInfo)
        {
            switch(oneAttrib->getType())
            {
            case XMLAttDef::CData:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
            case XMLAttDef::ID:             attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
            case XMLAttDef::IDRef:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
            case XMLAttDef::IDRefs:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
            case XMLAttDef::Entity:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
            case XMLAttDef::Entities:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
            case XMLAttDef::NmToken:        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
            case XMLAttDef::NmTokens:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
            case XMLAttDef::Notation:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
            case XMLAttDef::Enumeration:    attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
            default:                        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
            }
        }
      }
    }

    //Set up the default attributes if any.
    //
    if (elemDecl.hasAttDefs())
    {
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {

                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // be done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    XMLBufBid bbPrefixQName(&fBufMgr);
                    XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                    int colonPos = -1;
                    unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                    const XMLCh* namespaceURI = 0;
                    if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))    //for xmlns=...
                        uriId = fScanner->getXMLNSNamespaceId();
                    if (uriId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix
                        namespaceURI = fScanner->getURIText(uriId);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(namespaceURI,     // NameSpaceURI
                                                                              qualifiedName);   // qualified name

                    DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());

                    DOMNode* remAttr = elemImpl->setDefaultAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                //need to do this before the get as otherwise we overwrite any value in the attr
                if (attr->getValue() != 0)
                {
                    insertAttr->setValueFast(attr->getValue());
                    insertAttr->setSpecified(false);
                }

                // store DTD validation information
                if(fCreateSchemaInfo)
                {
                    switch(attr->getType())
                    {
                    case XMLAttDef::CData:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
                    case XMLAttDef::ID:             insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
                    case XMLAttDef::IDRef:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
                    case XMLAttDef::IDRefs:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
                    case XMLAttDef::Entity:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
                    case XMLAttDef::Entities:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
                    case XMLAttDef::NmToken:        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
                    case XMLAttDef::NmTokens:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
                    case XMLAttDef::Notation:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
                    case XMLAttDef::Enumeration:    insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
                    default:                        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
                    }
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    if (fCurrentParent != fDocument)
      castToParentImpl (fCurrentParent)->appendChildFast (elem);
    else
      fCurrentParent->appendChild (elem);

    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}